

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x___Test::Body(iu_Matcher_x_iutest_x___Test *this)

{
  bool bVar1;
  detail *pdVar2;
  X **v;
  AssertionResult *in_R8;
  undefined8 *local_6a0;
  string local_698;
  string local_678;
  AssertionHelper local_658;
  Fixed local_628;
  X *local_4a0;
  undefined1 local_498 [8];
  AssertionResult iutest_ar_2;
  string local_450;
  AssertionHelper local_430;
  Fixed local_400;
  undefined1 local_278 [8];
  AssertionResult iutest_ar_1;
  string local_248;
  string local_228;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x___Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = 0x2a;
  iutest::detail::AnythingMatcher::operator()
            ((AssertionResult *)local_38,(AnythingMatcher *)&iutest::matchers::_,&local_3c);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    iutest_ar_1._36_4_ = 0x2a;
    iutest::PrintToString<int>(&local_248,(int *)&iutest_ar_1.field_0x24);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_(&local_228,pdVar2,"_",local_38,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x188,&local_228,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::detail::AnythingMatcher::operator()
            ((AssertionResult *)local_278,(AnythingMatcher *)&iutest::matchers::_,
             (X *)&(anonymous_namespace)::gx);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    memset(&local_400,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_400);
    iutest::PrintToString<(anonymous_namespace)::X>
              ((string *)&iutest_ar_2.m_result,(X *)&(anonymous_namespace)::gx);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_(&local_450,pdVar2,"_",local_278,in_R8)
    ;
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_430,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x189,&local_450,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_430,&local_400);
    iutest::AssertionHelper::~AssertionHelper(&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_400);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  iutest::detail::AlwaysZero();
  local_4a0 = (X *)&(anonymous_namespace)::gx;
  iutest::detail::AnythingMatcher::operator()
            ((AssertionResult *)local_498,(AnythingMatcher *)&iutest::matchers::_,&local_4a0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    memset(&local_628,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_628);
    local_6a0 = &(anonymous_namespace)::gx;
    iutest::PrintToString<(anonymous_namespace)::X*>(&local_698,(iutest *)&local_6a0,v);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_(&local_678,pdVar2,"_",local_498,in_R8)
    ;
    iutest::AssertionHelper::AssertionHelper
              (&local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x18a,&local_678,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_658,&local_628);
    iutest::AssertionHelper::~AssertionHelper(&local_658);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_698);
    iutest::AssertionHelper::Fixed::~Fixed(&local_628);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  return;
}

Assistant:

IUTEST(Matcher, _)
{
    IUTEST_EXPECT_THAT( 42, _);
    IUTEST_EXPECT_THAT( gx, _);
    IUTEST_EXPECT_THAT(&gx, _);
}